

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

char * cppcms_capi_session_get(cppcms_capi_session *session,char *key)

{
  char *pcVar1;
  bool bVar2;
  char *in_RSI;
  long in_RDI;
  string *in_stack_ffffffffffffff38;
  allocator *paVar3;
  cppcms_capi_session *in_stack_ffffffffffffff40;
  allocator local_91;
  string local_90 [32];
  string *in_stack_ffffffffffffff90;
  session_interface *in_stack_ffffffffffffff98;
  allocator local_49;
  string local_48 [48];
  char *local_18;
  long local_10;
  char *local_8;
  
  if (in_RDI == 0) {
    local_8 = (char *)0x0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    anon_unknown.dwarf_2860d0::check_str((char *)in_stack_ffffffffffffff40);
    cppcms_capi_session::check_loaded(in_stack_ffffffffffffff40);
    booster::hold_ptr<cppcms::session_interface>::operator->
              ((hold_ptr<cppcms::session_interface> *)(local_10 + 0x78));
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,&local_49);
    bVar2 = cppcms::session_interface::is_set
                      ((session_interface *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      booster::hold_ptr<cppcms::session_interface>::operator->
                ((hold_ptr<cppcms::session_interface> *)(local_10 + 0x78));
      paVar3 = &local_91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,local_18,paVar3);
      cppcms::session_interface::get(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      std::__cxx11::string::operator=
                ((string *)(local_10 + 0xb8),(string *)&stack0xffffffffffffff90);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      local_8 = (char *)std::__cxx11::string::c_str();
    }
    else {
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

char const *cppcms_capi_session_get(cppcms_capi_session *session,char const *key)
{
	TRY {
		if(!session)
			return 0;
		check_str(key);
		session->check_loaded();
		if(!session->p->is_set(key))
			return 0;
		session->returned_value = session->p->get(key);
		return session->returned_value.c_str();
	}